

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O3

void __thiscall OpenMD::PotVecAccumulator::getStdDev(PotVecAccumulator *this,ResultType *ret)

{
  uint i;
  long lVar1;
  uint i_1;
  double dVar2;
  double dVar3;
  ResultType var;
  double local_48 [7];
  
  local_48[4] = 0.0;
  local_48[5] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[6] = 0.0;
  lVar1 = 0;
  do {
    dVar2 = (this->Avg_).data_[lVar1];
    dVar3 = (this->Avg2_).data_[lVar1] - dVar2 * dVar2;
    dVar2 = 0.0;
    if (0.0 <= dVar3) {
      dVar2 = dVar3;
    }
    local_48[lVar1] = dVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  lVar1 = 0;
  do {
    dVar2 = local_48[lVar1];
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    ret->data_[lVar1] = dVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  return;
}

Assistant:

void getStdDev(ResultType& ret) {
      assert(Count_ != 0);
      ResultType var;
      this->getVariance(var);
      for (unsigned int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        ret[i] = sqrt(var[i]);
      }
      return;
    }